

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomrestartmethod.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
randomRestartMethod::optimize
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,randomRestartMethod *this)

{
  backtrackingLineSearch *pbVar1;
  bool bVar2;
  pointer pdVar3;
  pointer pdVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  uint uVar12;
  size_t __i;
  long lVar13;
  long *plVar14;
  double *pdVar15;
  pointer *ppdVar16;
  double dVar17;
  initializer_list<double> __l;
  string logFileName;
  string __str;
  vector<double,_std::allocator<double>_> x;
  random_device rd;
  mt19937 gen;
  vector<double,_std::allocator<double>_> local_2808;
  undefined8 uStack_27f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_27e8;
  double local_27e0;
  double local_27d8;
  long *local_27d0;
  uint local_27c8;
  long local_27c0 [2];
  long *local_27b0;
  long local_27a8;
  long local_27a0;
  long lStack_2798;
  string local_2790;
  vector<double,_std::allocator<double>_> local_2770;
  vector<double,_std::allocator<double>_> local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_27e8 = __return_storage_ptr__;
  std::random_device::random_device(&local_2740);
  uVar7 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar7;
  lVar13 = 1;
  uVar8 = local_13b8._M_x[0];
  do {
    uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar13);
    local_13b8._M_x[lVar13] = uVar8;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x270);
  local_13b8._M_p = 0x270;
  local_27d8 = this->from;
  local_27e0 = this->to - local_27d8;
  uVar7 = 0;
  do {
    ppdVar16 = &local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    dVar17 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(dVar17 * local_27e0 + local_27d8);
    dVar17 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(dVar17 * local_27e0 + local_27d8);
    __l._M_len = 2;
    __l._M_array = (iterator)&local_2808;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2758,__l,(allocator_type *)&local_27b0);
    if ((this->super_optimizer).verbose != 0) {
      cVar6 = '\x01';
      if (9 < uVar7) {
        cVar5 = '\x04';
        uVar12 = uVar7;
        do {
          cVar6 = cVar5;
          if (uVar12 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0010635d;
          }
          if (uVar12 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0010635d;
          }
          if (uVar12 < 10000) goto LAB_0010635d;
          bVar2 = 99999 < uVar12;
          cVar5 = cVar6 + '\x04';
          uVar12 = uVar12 / 10000;
        } while (bVar2);
        cVar6 = cVar6 + '\x01';
      }
LAB_0010635d:
      local_27d0 = local_27c0;
      std::__cxx11::string::_M_construct((ulong)&local_27d0,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_27d0,local_27c8,uVar7);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_27d0,0,(char *)0x0,0x1081b0);
      plVar14 = plVar9 + 2;
      if ((long *)*plVar9 == plVar14) {
        local_27a0 = *plVar14;
        lStack_2798 = plVar9[3];
        local_27b0 = &local_27a0;
      }
      else {
        local_27a0 = *plVar14;
        local_27b0 = (long *)*plVar9;
      }
      local_27a8 = plVar9[1];
      *plVar9 = (long)plVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_27b0);
      pdVar15 = (double *)(puVar10 + 2);
      if ((pointer *)*puVar10 == (pointer *)pdVar15) {
        local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar15;
        uStack_27f0 = puVar10[3];
        local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppdVar16;
      }
      else {
        local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar15;
        local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar10;
      }
      local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)puVar10[1];
      *puVar10 = pdVar15;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if (local_27b0 != &local_27a0) {
        operator_delete(local_27b0,local_27a0 + 1);
      }
      if (local_27d0 != local_27c0) {
        operator_delete(local_27d0,local_27c0[0] + 1);
      }
      pbVar1 = this->unconstraint_optimizer;
      local_2790._M_dataplus._M_p = (pointer)&local_2790.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2790,
                 local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (long)local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
      optimizer::setLogFileName(&pbVar1->super_optimizer,&local_2790);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2790._M_dataplus._M_p != &local_2790.field_2) {
        operator_delete(local_2790._M_dataplus._M_p,local_2790.field_2._M_allocated_capacity + 1);
      }
      optimizer::setVerbose
                (&this->unconstraint_optimizer->super_optimizer,(this->super_optimizer).verbose);
      if ((pointer *)
          local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != ppdVar16) {
        operator_delete(local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
    pbVar1 = this->unconstraint_optimizer;
    std::vector<double,_std::allocator<double>_>::vector(&local_2770,&local_2758);
    backtrackingLineSearch::set_x0(pbVar1,&local_2770);
    if (local_2770.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2770.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2770.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2770.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    backtrackingLineSearch::optimize(&local_2808,this->unconstraint_optimizer);
    pdVar4 = local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar3 = local_2808.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar11 = std::ostream::_M_insert<double>
                        ((double)*local_2808.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    poVar11 = std::ostream::_M_insert<double>(pdVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    uVar7 = uVar7 + 1;
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3);
    if (local_2758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (this->no_restarts < uVar7) {
      if ((this->super_optimizer).verbose == 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Plotting the solutions",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        system("gnuplot -p -e \'load \"../logs/solutionPath.plt\"\'");
      }
      std::random_device::_M_fini();
      return local_27e8;
    }
  } while( true );
}

Assistant:

vector<vector<double>>  randomRestartMethod::optimize(){
    vector<vector<double>> opt_count;
    random_device rd;
    std::mt19937 gen(rd()); //Standard mersenne_twister_engine seeded with rd()
    std::uniform_real_distribution<> dis(from,to);

    for(uint i=0;i<=no_restarts;i++){
        vector<double> x={dis(gen),dis(gen)};
        vector<double> x_opt;
        if(verbose!=0){
            string logFileName="../logs/solutionPath"+to_string(i)+".dat";
            unconstraint_optimizer->setLogFileName(logFileName);
            unconstraint_optimizer->setVerbose(verbose);
        }
        unconstraint_optimizer->set_x0(x);
        x_opt=unconstraint_optimizer->optimize();
        cout<<x_opt[0]<<" "<<x_opt[1]<<" "<<(i+1)<<endl;
    }
    if (verbose == 2){
        std::cout<<"Plotting the solutions"<<std::endl;
        system("gnuplot -p -e 'load \"../logs/solutionPath.plt\"'");
    }
    return opt_count;
}